

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

sexp sexp_bignum_fxrem(sexp ctx,sexp a,sexp_sint_t b)

{
  sexp_uint_t sVar1;
  sexp psVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  sVar1 = sexp_bignum_hi(a);
  if ((b < 1) ||
     (uVar3 = b - ((ulong)b >> 1 & 0x5555555555555555),
     uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333),
     1 < (byte)(((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38))) {
    if (b == 0) {
      psVar2 = sexp_xtype_exception(ctx,(sexp)0x0,"divide by zero",a);
      return psVar2;
    }
    lVar5 = -b;
    if (0 < b) {
      lVar5 = b;
    }
    uVar3 = sVar1 & 0xffffffff;
    lVar4 = 0;
    while( true ) {
      uVar3 = uVar3 - 1;
      if ((int)(uint)uVar3 < 0) break;
      lVar4 = __umodti3(*(undefined8 *)
                         ((long)&a->value + (ulong)((uint)uVar3 & 0x7fffffff) * 8 + 0x10),lVar4,
                        lVar5,0);
    }
    lVar4 = lVar4 * (a->value).flonum_bits[0];
  }
  else {
    lVar4 = (b - 1U & (a->value).string.length) * (long)(a->value).flonum_bits[0];
  }
  return (sexp)(lVar4 * 2 + 1);
}

Assistant:

sexp sexp_bignum_fxrem (sexp ctx, sexp a, sexp_sint_t b) {
  sexp_uint_t len=sexp_bignum_hi(a), *data=sexp_bignum_data(a), q, b0;
  int i;
  sexp_luint_t n = luint_from_uint(0);
  if (b > 0) {
    q = b - 1;
    if ((b & q) == 0)
      return sexp_make_fixnum(sexp_bignum_sign(a) * (data[0] & q));
  }
  b0 = (b >= 0) ? b : -b;
  if (b0 == 0) {
    return sexp_xtype_exception(ctx, NULL, "divide by zero", a);
  }
  for (i=len-1; i>=0; i--) {
    n = luint_add(luint_shl(n, sizeof(sexp_uint_t)*8), luint_from_uint(data[i]));
    q = luint_to_uint(luint_div_uint(n, b0));
    n = luint_sub(n, luint_mul_uint(luint_from_uint(q), b0));
  }
  return sexp_make_fixnum(sexp_bignum_sign(a) * (sexp_sint_t)luint_to_uint(n));
}